

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::parseImports(StructuralParser *this,Namespace *parentNamespace)

{
  bool bVar1;
  ImportsList *pIVar2;
  char (*args) [18];
  CompileMessage local_168;
  char *local_130;
  CompileMessage local_128;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  undefined1 local_88 [8];
  string name;
  string local_48;
  char *local_28;
  char *local_20;
  Namespace *local_18;
  Namespace *parentNamespace_local;
  StructuralParser *this_local;
  
  local_18 = parentNamespace;
  parentNamespace_local = (Namespace *)this;
  while( true ) {
    local_20 = "import";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"import");
    if (!bVar1) break;
    local_28 = "$string literal";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)"$string literal");
    if (bVar1) {
      pIVar2 = &local_18->importsList;
      std::__cxx11::string::string
                ((string *)&local_48,(string *)&(this->super_SOULTokeniser).currentStringValue);
      AST::ImportsList::addIfNotAlreadyThere(pIVar2,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"$string literal");
    }
    else {
      name.field_2._8_8_ = anon_var_dwarf_d45aa;
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)"$identifier");
      if (bVar1) {
        Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
        ::readIdentifier_abi_cxx11_
                  ((string *)local_88,
                   (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                    *)this);
        while( true ) {
          local_90 = ".";
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d44a1);
          if (!bVar1) break;
          Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::readIdentifier_abi_cxx11_
                    (&local_d0,
                     (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this);
          std::operator+(&local_b0,".",&local_d0);
          std::__cxx11::string::operator+=((string *)local_88,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        pIVar2 = &local_18->importsList;
        std::__cxx11::string::string((string *)&local_f0,(string *)local_88);
        AST::ImportsList::addIfNotAlreadyThere(pIVar2,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)local_88);
      }
      else {
        Errors::expectedModule<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_128);
        CompileMessage::~CompileMessage(&local_128);
      }
    }
    local_130 = ";";
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4ad30b);
    Errors::notYetImplemented<char_const(&)[18]>(&local_168,(Errors *)"import statements",args);
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_168);
    CompileMessage::~CompileMessage(&local_168);
  }
  return;
}

Assistant:

void parseImports (AST::Namespace& parentNamespace)
    {
        while (matchIf (Keyword::import))
        {
            if (matches (Token::literalString))
            {
                parentNamespace.importsList.addIfNotAlreadyThere (currentStringValue);
                expect (Token::literalString);
            }
            else if (matches (Token::identifier))
            {
                auto name = readIdentifier();

                while (matchIf (Operator::dot))
                    name += "." + readIdentifier();

                parentNamespace.importsList.addIfNotAlreadyThere (name);
            }
            else
            {
                throwError (Errors::expectedModule());
            }

            expect (Operator::semicolon);
            throwError (Errors::notYetImplemented ("import statements"));
        }
    }